

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O3

void __thiscall Cmd::editMovePrevWord(Cmd *this,State *state)

{
  size_type sVar1;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  pointer pcVar5;
  size_type sVar6;
  ulong uVar7;
  bool bVar8;
  string sStack_98;
  char acStack_78 [72];
  
  sVar3 = state->pos;
  if (sVar3 == 0) {
code_r0x00104584:
    if (this->multiline_mode != true) {
      sVar1 = (this->prompt)._M_string_length;
      pcVar5 = (state->buf)._M_dataplus._M_p;
      sVar6 = (state->buf)._M_string_length;
      sStack_98._M_dataplus._M_p = (pointer)&sStack_98.field_2;
      sStack_98._M_string_length = 0;
      sStack_98.field_2._M_local_buf[0] = '\0';
      uVar2 = state->cols;
      uVar7 = state->pos + sVar1;
      uVar4 = uVar7;
      if (uVar2 <= uVar7) {
        uVar4 = uVar2 - 1;
        if (uVar7 - 1 < uVar2 - 1) {
          uVar4 = uVar7 - 1;
        }
        sVar6 = (sVar6 + uVar4) - uVar7;
        pcVar5 = pcVar5 + (uVar7 - uVar4);
      }
      uVar7 = sVar6 + sVar1;
      if (uVar2 < sVar6 + sVar1) {
        uVar7 = uVar2;
      }
      std::__cxx11::string::append((char *)&sStack_98);
      std::__cxx11::string::_M_append((char *)&sStack_98,(ulong)(this->prompt)._M_dataplus._M_p);
      if (state->mask_mode == true) {
        std::__cxx11::string::_M_replace_aux
                  ((ulong)&sStack_98,sStack_98._M_string_length,0,(char)uVar7 - (char)sVar1);
      }
      else {
        std::__cxx11::string::append((char *)&sStack_98,(ulong)pcVar5);
      }
      refreshShowHints(this,&sStack_98,state,(int)sVar1);
      std::__cxx11::string::append((char *)&sStack_98);
      snprintf(acStack_78,0x40,"\r\x1b[%dC",uVar4 & 0xffffffff);
      std::__cxx11::string::append((char *)&sStack_98);
      write(this->out_fd_,sStack_98._M_dataplus._M_p,sStack_98._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_98._M_dataplus._M_p != &sStack_98.field_2) {
        operator_delete(sStack_98._M_dataplus._M_p,
                        CONCAT71(sStack_98.field_2._M_allocated_capacity._1_7_,
                                 sStack_98.field_2._M_local_buf[0]) + 1);
      }
      return;
    }
    refreshMultiLine(this,state);
    return;
  }
  pcVar5 = (state->buf)._M_dataplus._M_p;
  do {
    sVar3 = sVar3 - 1;
    if (pcVar5[sVar3] != ' ') {
      pcVar5 = (state->buf)._M_dataplus._M_p;
      goto LAB_001046ee;
    }
    state->pos = sVar3;
  } while (sVar3 != 0);
LAB_00104702:
  refreshLine(this,state);
  return;
  while( true ) {
    state->pos = sVar3;
    bVar8 = sVar3 == 0;
    sVar3 = sVar3 - 1;
    if (bVar8) break;
LAB_001046ee:
    if (pcVar5[sVar3] == ' ') goto code_r0x00104584;
  }
  goto LAB_00104702;
}

Assistant:

void editMovePrevWord(State *state) {
		while (state->pos > 0 && state->buf[state->pos - 1] == ' ')
			state->pos--;

		while (state->pos > 0 && state->buf[state->pos - 1] != ' ')
			state->pos--;

		refreshLine(state);
	}